

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::sessionFixtureTimeIsOutsideSessionTimeHelper::RunImpl
          (sessionFixtureTimeIsOutsideSessionTimeHelper *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_98;
  UtcTimeStamp outsideSessionTime;
  UtcTimeStamp fixedEndTime;
  UtcTimeStamp fixedStartTime;
  
  FIX::UtcTimeStamp::UtcTimeStamp(&fixedStartTime,8,8,8,5,0xd,0x7e3);
  FIX::UtcTimeStamp::UtcTimeStamp(&fixedEndTime,0x10,0x10,0x10,5,0xd,0x7e3);
  (this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.field_0xc
       = fixedStartTime.super_DateTime._12_8_;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_time + 4) =
       fixedStartTime.super_DateTime.m_time._4_4_;
  (this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.field_0xc =
       fixedEndTime.super_DateTime._12_8_;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_time + 4) =
       fixedEndTime.super_DateTime.m_time._4_4_;
  (*(this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder[8])
            (this,1,0xffffffff);
  FIX::UtcTimeStamp::UtcTimeStamp(&outsideSessionTime,0x14,0x14,0x14,5,0xd,0x7e3);
  bVar1 = FIX::TimeRange::isInRange
                    ((TimeRange *)((this->super_sessionFixture).object + 0x178),&outsideSessionTime)
  ;
  if (bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_98,*ppTVar3,0x65f);
    UnitTest::TestResults::OnTestFailure
              (this_00,&local_98,"!object->isSessionTime(outsideSessionTime)");
  }
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, TimeIsOutsideSessionTime) {
  UtcTimeStamp fixedStartTime = UtcTimeStamp(8, 8, 8, 5, 13, 2019);
  UtcTimeStamp fixedEndTime = UtcTimeStamp(16, 16, 16, 5, 13, 2019);

  startTime = UtcTimeOnly( fixedStartTime );
  endTime = UtcTimeOnly( fixedEndTime );
  createSession(1);

  UtcTimeStamp outsideSessionTime = UtcTimeStamp(20, 20, 20, 5, 13, 2019);

  CHECK(!object->isSessionTime(outsideSessionTime));
}